

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void __thiscall IniProcessing::IniProcessing(IniProcessing *this,IniProcessing *ip)

{
  IniProcessing *ip_local;
  IniProcessing *this_local;
  
  params::params(&this->m_params,&ip->m_params);
  return;
}

Assistant:

IniProcessing::IniProcessing(const IniProcessing &ip) :
    m_params(ip.m_params)
{}